

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::UnblindRawTransaction
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::UnblindRawTransactionResponseStruct_(const_cfd::js::api::UnblindRawTransactionRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::UnblindRawTransactionResponseStruct(cfd::js::api::UnblindRawTransactionRequestStruct_const&)>
  ::
  function<cfd::js::api::UnblindRawTransactionResponseStruct(&)(cfd::js::api::UnblindRawTransactionRequestStruct_const&),void>
            ((function<cfd::js::api::UnblindRawTransactionResponseStruct(cfd::js::api::UnblindRawTransactionRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::UnblindTransaction);
  ExecuteJsonApi<cfd::js::api::json::UnblindRawTransactionRequest,cfd::js::api::json::UnblindRawTransactionResponse,cfd::js::api::UnblindRawTransactionRequestStruct,cfd::js::api::UnblindRawTransactionResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::UnblindRawTransactionResponseStruct_(const_cfd::js::api::UnblindRawTransactionRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::UnblindRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::UnblindRawTransactionRequest,
      api::json::UnblindRawTransactionResponse,
      api::UnblindRawTransactionRequestStruct,
      api::UnblindRawTransactionResponseStruct>(
      request_message, ElementsTransactionStructApi::UnblindTransaction);
}